

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWO2TextureHeader(LWOImporter *this,uint size,Texture *tex)

{
  uint8_t **outFile;
  uint uVar1;
  uint8_t *puVar2;
  uint *puVar3;
  uint32_t uVar4;
  Logger *this_00;
  SubChunkHeader SVar5;
  DeadlyImportError *this_01;
  uint8_t *puVar6;
  allocator local_49;
  string local_48;
  
  outFile = &this->mFileBuffer;
  puVar2 = this->mFileBuffer;
  GetS0(this,&tex->ordinal,size);
  if ((tex->ordinal)._M_string_length == 0) {
    this_00 = DefaultLogger::get();
    Logger::error(this_00,"LWO2: Ill-formed SURF.BLOK ordinal string");
    std::__cxx11::string::assign((char *)&tex->ordinal);
  }
  puVar6 = *outFile;
  while( true ) {
    if (puVar2 + size <= puVar6 + 6) {
      return;
    }
    SVar5 = IFF::LoadSubChunk(outFile);
    puVar3 = (uint *)*outFile;
    puVar6 = (uint8_t *)(((ulong)SVar5 >> 0x20 & 0xffff) + (long)puVar3);
    if (puVar2 + size < puVar6) break;
    uVar4 = SVar5.type;
    if (uVar4 == 0x4f504143) {
      uVar1 = *puVar3;
      *outFile = (uint8_t *)((long)puVar3 + 2);
      tex->blendType = (uint)(ushort)((ushort)uVar1 << 8 | (ushort)uVar1 >> 8);
      uVar1 = *(uint *)*outFile;
      *outFile = (uint8_t *)((long)*outFile + 4);
      tex->mStrength =
           (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    }
    else if (uVar4 == 0x454e4142) {
      uVar1 = *puVar3;
      *outFile = (uint8_t *)((long)puVar3 + 2);
      tex->enabled = (ushort)uVar1 != 0;
    }
    else if (uVar4 == 0x4348414e) {
      uVar1 = *puVar3;
      *outFile = (uint8_t *)(puVar3 + 1);
      tex->type = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    *outFile = puVar6;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_48,"LWO2: Invalid texture header chunk length",&local_49);
  DeadlyImportError::DeadlyImportError(this_01,&local_48);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LWOImporter::LoadLWO2TextureHeader(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    // get the ordinal string
    GetS0( tex.ordinal, size);

    // we could crash later if this is an empty string ...
    if (!tex.ordinal.length())
    {
        ASSIMP_LOG_ERROR("LWO2: Ill-formed SURF.BLOK ordinal string");
        tex.ordinal = "\x00";
    }
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid texture header chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_CHAN:
            tex.type = GetU4();
            break;
        case AI_LWO_ENAB:
            tex.enabled = GetU2() ? true : false;
            break;
        case AI_LWO_OPAC:
            tex.blendType = (Texture::BlendType)GetU2();
            tex.mStrength = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}